

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

string * __thiscall helics::FederateState::getTag_abi_cxx11_(FederateState *this,string_view tag)

{
  __atomic_flag_data_type _Var1;
  pointer ppVar2;
  int iVar3;
  pointer ppVar4;
  size_t __n;
  size_type __rlen;
  string *psVar5;
  
  __n = tag._M_len;
  do {
    LOCK();
    _Var1 = (this->processing).super___atomic_flag_base._M_i;
    (this->processing).super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var1 != false);
  ppVar4 = (this->tags).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->tags).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != ppVar2) {
    psVar5 = (string *)&ppVar4->second;
    do {
      if ((psVar5[-1]._M_string_length == __n) &&
         ((__n == 0 || (iVar3 = bcmp(tag._M_str,psVar5[-1]._M_dataplus._M_p,__n), iVar3 == 0)))) {
        LOCK();
        (this->processing).super___atomic_flag_base._M_i = false;
        UNLOCK();
        return psVar5;
      }
      ppVar4 = (pointer)(psVar5 + 1);
      psVar5 = psVar5 + 2;
    } while (ppVar4 != ppVar2);
  }
  LOCK();
  (this->processing).super___atomic_flag_base._M_i = false;
  UNLOCK();
  return &gHelicsEmptyStr_abi_cxx11_;
}

Assistant:

const std::string& FederateState::getTag(std::string_view tag) const
{
    spinlock();
    for (const auto& existingTag : tags) {
        if (existingTag.first == tag) {
            unlock();
            return existingTag.second;
        }
    }
    unlock();
    return gHelicsEmptyStr;
}